

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O3

void __thiscall
amrex::BndryRegister::BndryRegister
          (BndryRegister *this,BoxArray *grids_,DistributionMapping *dmap,int in_rad,int out_rad,
          int extent_rad,int ncomp)

{
  Orientation _face;
  long lVar1;
  
  this->_vptr_BndryRegister = (_func_int **)&PTR__BndryRegister_0080d1e0;
  lVar1 = 8;
  do {
    FabSet::FabSet((FabSet *)((long)this->bndry + lVar1 + -8));
    lVar1 = lVar1 + 0x180;
  } while (lVar1 != 0x908);
  BoxArray::BoxArray(&this->grids,grids_);
  _face.val = 0;
  do {
    define(this,_face,(IndexType)0x0,in_rad,out_rad,extent_rad,ncomp,dmap);
    _face.val = _face.val + 1;
  } while (_face.val != 6);
  return;
}

Assistant:

BndryRegister::BndryRegister (const BoxArray& grids_,
                              const DistributionMapping& dmap,
                              int             in_rad,
                              int             out_rad,
                              int             extent_rad,
                              int             ncomp)
    :
    grids(grids_)
{
    BL_ASSERT(ncomp > 0);
    BL_ASSERT(grids[0].cellCentered());

    for (OrientationIter face; face; ++face)
    {
        define(face(),IndexType::TheCellType(),in_rad,out_rad,extent_rad,ncomp,dmap);
    }
}